

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qshareddata.h
# Opt level: O3

void __thiscall
QSharedDataPointer<QFileInfoPrivate>::detach_helper(QSharedDataPointer<QFileInfoPrivate> *this)

{
  QFileInfoPrivate *pQVar1;
  Data *pDVar2;
  Data *pDVar3;
  qint64 qVar4;
  qint64 qVar5;
  qint64 qVar6;
  qint64 qVar7;
  qint64 qVar8;
  qint16 qVar9;
  MetaDataFlags MVar10;
  uint uVar11;
  QFileInfoPrivate *pQVar12;
  long lVar13;
  
  pQVar12 = (QFileInfoPrivate *)operator_new(0x1e8);
  pQVar1 = (this->d).ptr;
  (pQVar12->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value
  .super___atomic_base<int> = (__atomic_base<int>)0x0;
  pDVar2 = (pQVar1->fileEntry).m_filePath.d.d;
  (pQVar12->fileEntry).m_filePath.d.d = pDVar2;
  (pQVar12->fileEntry).m_filePath.d.ptr = (pQVar1->fileEntry).m_filePath.d.ptr;
  (pQVar12->fileEntry).m_filePath.d.size = (pQVar1->fileEntry).m_filePath.d.size;
  if (pDVar2 != (Data *)0x0) {
    LOCK();
    (pDVar2->super_QArrayData).ref_._q_value =
         (Type)((int)(pDVar2->super_QArrayData).ref_._q_value + 1);
    UNLOCK();
  }
  pDVar3 = (pQVar1->fileEntry).m_nativeFilePath.d.d;
  (pQVar12->fileEntry).m_nativeFilePath.d.d = pDVar3;
  (pQVar12->fileEntry).m_nativeFilePath.d.ptr = (pQVar1->fileEntry).m_nativeFilePath.d.ptr;
  (pQVar12->fileEntry).m_nativeFilePath.d.size = (pQVar1->fileEntry).m_nativeFilePath.d.size;
  if (pDVar3 != (Data *)0x0) {
    LOCK();
    (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int> =
         (__atomic_base<int>)
         ((__int_type)(pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int> + 1);
    UNLOCK();
  }
  (pQVar12->fileEntry).m_lastDotInFileName = (pQVar1->fileEntry).m_lastDotInFileName;
  qVar9 = (pQVar1->fileEntry).m_firstDotInFileName;
  (pQVar12->fileEntry).m_lastSeparator = (pQVar1->fileEntry).m_lastSeparator;
  (pQVar12->fileEntry).m_firstDotInFileName = qVar9;
  MVar10.super_QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>.
  super_QFlagsStorage<QFileSystemMetaData::MetaDataFlag>.i =
       (pQVar1->metaData).entryFlags.super_QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>
  ;
  qVar4 = (pQVar1->metaData).size_;
  qVar5 = (pQVar1->metaData).accessTime_;
  qVar6 = (pQVar1->metaData).birthTime_;
  qVar7 = (pQVar1->metaData).metadataChangeTime_;
  qVar8 = (pQVar1->metaData).modificationTime_;
  (pQVar12->metaData).knownFlagsMask =
       (QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>)
       (pQVar1->metaData).knownFlagsMask.
       super_QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>;
  (pQVar12->metaData).entryFlags =
       (MetaDataFlags)
       MVar10.super_QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>.
       super_QFlagsStorage<QFileSystemMetaData::MetaDataFlag>.i;
  (pQVar12->metaData).size_ = qVar4;
  (pQVar12->metaData).accessTime_ = qVar5;
  (pQVar12->metaData).birthTime_ = qVar6;
  (pQVar12->metaData).metadataChangeTime_ = qVar7;
  (pQVar12->metaData).modificationTime_ = qVar8;
  uVar11 = (pQVar1->metaData).groupId_;
  (pQVar12->metaData).userId_ = (pQVar1->metaData).userId_;
  (pQVar12->metaData).groupId_ = uVar11;
  QFileSystemEngine::createLegacyEngine
            ((QFileSystemEntry *)&pQVar12->fileEngine,(QFileSystemMetaData *)&pQVar12->fileEntry);
  memset(pQVar12->fileNames,0,0x138);
  lVar13 = 0x1b8;
  do {
    QDateTime::QDateTime((QDateTime *)((long)pQVar12->fileNames + lVar13 + -0x80));
    lVar13 = lVar13 + 8;
  } while (lVar13 != 0x1d8);
  *(uint *)&pQVar12->field_0x1d8 = *(uint *)&pQVar1->field_0x1d8 & 0x80000000;
  pQVar12->fileFlags = 0;
  pQVar12->fileSize = 0;
  LOCK();
  (pQVar12->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value
  .super___atomic_base<int> =
       (__atomic_base<int>)
       ((__int_type)
        (pQVar12->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value.super___atomic_base<int> + 1);
  UNLOCK();
  pQVar1 = (this->d).ptr;
  LOCK();
  (pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int> =
       (__atomic_base<int>)
       ((__int_type)
        (pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value.super___atomic_base<int> + -1);
  UNLOCK();
  if ((__int_type)
      (pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
      _q_value.super___atomic_base<int> == 0) {
    pQVar1 = (this->d).ptr;
    if (pQVar1 != (QFileInfoPrivate *)0x0) {
      QFileInfoPrivate::~QFileInfoPrivate(pQVar1);
    }
    operator_delete(pQVar1,0x1e8);
  }
  (this->d).ptr = pQVar12;
  return;
}

Assistant:

Q_OUTOFLINE_TEMPLATE void QSharedDataPointer<T>::detach_helper()
{
    T *x = clone();
    x->ref.ref();
    if (!d.get()->ref.deref())
        delete d.get();
    d.reset(x);
}